

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

int pnga_sprs_array_access_col_block_idx
              (Integer s_a,Integer icol,AccessIndex *idx,AccessIndex *jdx,AccessIndex *vdx)

{
  long lVar1;
  SingleComplex **ppSVar2;
  SingleComplex *pSVar3;
  Integer *jptr;
  Integer *iptr;
  void *vptr;
  long local_48;
  long local_40;
  long local_38;
  
  pnga_sprs_array_access_col_block(s_a,icol,&local_40,&local_48,&local_38);
  pSVar3 = (SingleComplex *)INT_MB;
  if ((local_40 == 0 && local_48 == 0) && local_38 == 0) {
    *idx = 0;
    *jdx = 0;
    *vdx = 0;
    return 0;
  }
  *idx = local_40 - (long)INT_MB >> 3;
  *jdx = local_48 - (long)pSVar3 >> 3;
  switch(SPA[s_a + 1000].type) {
  case 0x3e9:
  case 0x3ea:
    goto switchD_001466bb_caseD_3e9;
  case 0x3eb:
    lVar1 = local_38 - (long)FLT_MB >> 2;
    break;
  case 0x3ec:
    ppSVar2 = (SingleComplex **)&DBL_MB;
    goto LAB_001466f3;
  default:
    goto switchD_001466bb_caseD_3ed;
  case 0x3ee:
    ppSVar2 = &SCPL_MB;
LAB_001466f3:
    pSVar3 = *ppSVar2;
switchD_001466bb_caseD_3e9:
    lVar1 = local_38 - (long)pSVar3 >> 3;
    break;
  case 0x3ef:
    lVar1 = local_38 - (long)DCPL_MB >> 4;
  }
  *vdx = lVar1;
switchD_001466bb_caseD_3ed:
  *idx = *idx + 1;
  return 1;
}

Assistant:

int pnga_sprs_array_access_col_block_idx(Integer s_a, Integer icol,
    AccessIndex *idx, AccessIndex *jdx, AccessIndex *vdx)
{
  Integer s_hdl = GA_OFFSET + s_a;
  void *vptr;
  Integer *iptr, *jptr;
  unsigned long lref=0, lptr;
  pnga_sprs_array_access_col_block(s_a, icol, &iptr, &jptr, &vptr);
  /* iproc corresponds to a block with no data */
  if (iptr == NULL && jptr == NULL && vptr == NULL) {
    *idx = 0;
    *jdx = 0;
    *vdx = 0;
    return 0;
  }
  *idx = (AccessIndex) ((Integer*)iptr - INT_MB);
  *jdx = (AccessIndex) ((Integer*)jptr - INT_MB);
  lref = (unsigned long)INT_MB;
  /* if that array data is a fortran integer then it will be set to either the
   * C int or long data type */
  if (SPA[s_hdl].type == C_INT || SPA[s_hdl].type == C_LONG) {
    *vdx = (AccessIndex) ((Integer*)vptr - INT_MB);
  } else if (SPA[s_hdl].type == C_FLOAT) {
    *vdx = (AccessIndex) ((float*)vptr - FLT_MB);
  } else if (SPA[s_hdl].type == C_DBL) {
    *vdx = (AccessIndex) ((double*)vptr - DBL_MB);
  } else if (SPA[s_hdl].type == C_SCPL) {
    *vdx = (AccessIndex) ((SingleComplex*)vptr - SCPL_MB);
  } else if (SPA[s_hdl].type == C_DCPL) {
    *vdx = (AccessIndex) ((DoubleComplex*)vptr - DCPL_MB);
  }

#ifdef BYTE_ADDRESSABLE_MEMORY
    /* check the allignment */
    lptr = (unsigned long)vptr;
    if( lptr%elemsize != lref%elemsize ){
      printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
          lref,lref%elemsize);
      pnga_error("sprs_array_access_col_block: MA addressing problem: base address misallignment",
          handle);
    }
#endif

    /* adjust index for Fortran addressing */
    (*idx) ++ ;
    FLUSH_CACHE;
    return 1;
}